

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O1

FileDescriptor __thiscall
google::OpenObjectFileContainingPcAndGetStartAddress
          (google *this,uint64_t pc,uint64_t *start_address,uint64_t *base_address,
          char *out_file_name,size_t out_file_name_size)

{
  int fd;
  int fd_00;
  int iVar1;
  int *piVar2;
  void *pvVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  ssize_t sVar7;
  ulong uVar8;
  int iVar9;
  char *pcVar10;
  char *end;
  anon_class_8_1_50ba0494 run;
  size_t incomplete_line_length;
  size_t __n;
  long lVar11;
  bool bVar12;
  uint64_t end_address;
  uint64_t file_offset;
  Elf64_Ehdr ehdr;
  char buf [1024];
  char *local_500;
  size_t local_4f0;
  ulong local_4b8;
  uint64_t local_4b0;
  long local_4a8;
  long local_4a0;
  int local_478 [4];
  short local_468;
  long local_458;
  ushort local_440;
  char local_438 [1032];
  
  do {
    fd = open("/proc/self/maps",0);
    if (fd != -1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  if (fd == -1) {
    *(undefined4 *)this = 0xffffffff;
  }
  else {
    do {
      fd_00 = open("/proc/self/mem",0);
      if (fd_00 != -1) break;
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
    if (fd_00 == -1) {
LAB_00120e18:
      *(undefined4 *)this = 0xffffffff;
    }
    else {
      pcVar10 = local_438;
      local_4f0 = 0;
      end = out_file_name;
      pcVar4 = pcVar10;
      do {
        if (local_438 == pcVar10) {
          lVar11 = ReadFromOffset(fd,local_438,0x400,local_4f0);
          if (0 < lVar11) {
            pcVar10 = local_438 + lVar11;
LAB_00120bfa:
            local_4f0 = local_4f0 + lVar11;
            pcVar5 = local_438;
            goto LAB_00120c02;
          }
LAB_00120c2d:
          bVar12 = false;
        }
        else {
          pcVar5 = pcVar4 + 1;
          if (pcVar10 < pcVar5) {
            abort();
          }
          __n = (long)pcVar10 - (long)pcVar5;
          pvVar3 = memchr(pcVar5,10,__n);
          if (pvVar3 == (void *)0x0) {
            memmove(local_438,pcVar5,__n);
            lVar11 = ReadFromOffset(fd,local_438 + __n,0x400 - __n,local_4f0);
            if (0 < lVar11) {
              pcVar10 = local_438 + __n + lVar11;
              goto LAB_00120bfa;
            }
            goto LAB_00120c2d;
          }
LAB_00120c02:
          pcVar4 = (char *)memchr(pcVar5,10,(long)pcVar10 - (long)pcVar5);
          if (pcVar4 == (char *)0x0) goto LAB_00120c2d;
          *pcVar4 = '\0';
          bVar12 = true;
          local_500 = pcVar5;
          end = pcVar4;
        }
        if ((((!bVar12) || (pcVar5 = GetHex(local_500,end,start_address), pcVar5 == end)) ||
            (*pcVar5 != '-')) ||
           ((pcVar5 = GetHex(pcVar5 + 1,end,&local_4b8), pcVar5 == end || (*pcVar5 != ' '))))
        goto LAB_00120e18;
        local_500 = pcVar5 + 1;
        bVar12 = true;
        if (local_500 < end) {
          uVar8 = (long)end - (long)pcVar5;
          uVar6 = 1;
          do {
            if (pcVar5[uVar6] == ' ') {
              uVar8 = uVar6;
              local_500 = pcVar5 + uVar6;
              break;
            }
            uVar6 = uVar6 + 1;
            local_500 = end;
          } while (uVar8 != uVar6);
          bVar12 = uVar8 < 5;
        }
        if ((bVar12) || (local_500 == end)) goto LAB_00120e18;
        if ((pcVar5[1] == 'r') &&
           ((sVar7 = ReadFromOffset(fd_00,local_478,0x40,*start_address), sVar7 == 0x40 &&
            (local_478[0] == 0x464c457f)))) {
          if (local_468 == 2) {
            *base_address = 0;
          }
          else if (local_468 == 3) {
            *base_address = *start_address;
            lVar11 = local_458;
            for (uVar8 = (ulong)local_440; uVar8 != 0; uVar8 = uVar8 - 1) {
              sVar7 = ReadFromOffset(fd_00,&local_4b0,0x38,*start_address + lVar11);
              if (((sVar7 == 0x38) && ((int)local_4b0 == 1)) && (local_4a8 == 0)) {
                *base_address = *start_address - local_4a0;
                break;
              }
              lVar11 = lVar11 + 0x38;
            }
          }
        }
      } while (((pc < *start_address) || (local_4b8 <= pc)) ||
              ((pcVar5[1] != 'r' || (pcVar5[3] != 'x'))));
      pcVar10 = end;
      pcVar4 = GetHex(local_500 + 1,end,&local_4b0);
      iVar1 = -1;
      if ((pcVar4 != end) && (*pcVar4 == ' ')) {
        pcVar5 = pcVar4 + 1;
        run.cursor = pcVar5;
        if (pcVar5 < end) {
          pcVar4 = end + ~(ulong)pcVar4;
          iVar9 = 0;
          do {
            if (*pcVar5 == ' ') {
              iVar9 = iVar9 + 1;
            }
            else {
              run.cursor = pcVar5;
              if (1 < iVar9) break;
            }
            pcVar5 = pcVar5 + 1;
            pcVar4 = pcVar4 + -1;
            run.cursor = end;
          } while (pcVar4 != (char *)0x0);
        }
        if ((run.cursor != end) &&
           (iVar1 = (anonymous_namespace)::
                    FailureRetry<google::OpenObjectFileContainingPcAndGetStartAddress(unsigned_long,unsigned_long&,unsigned_long&,char*,unsigned_long)::__2>
                              (run,(int)pcVar10), iVar1 == -1)) {
          strncpy(out_file_name,run.cursor,out_file_name_size);
          out_file_name[out_file_name_size - 1] = '\0';
          iVar1 = -1;
        }
      }
      *(int *)this = iVar1;
    }
    if (fd_00 != -1) {
      close(fd_00);
    }
  }
  if (fd != -1) {
    close(fd);
  }
  return (FileDescriptor)(int)this;
}

Assistant:

static ATTRIBUTE_NOINLINE FileDescriptor
OpenObjectFileContainingPcAndGetStartAddress(uint64_t pc,
                                             uint64_t& start_address,
                                             uint64_t& base_address,
                                             char* out_file_name,
                                             size_t out_file_name_size) {
  FileDescriptor maps_fd{
      FailureRetry([] { return open("/proc/self/maps", O_RDONLY); })};
  if (!maps_fd) {
    return nullptr;
  }

  FileDescriptor mem_fd{
      FailureRetry([] { return open("/proc/self/mem", O_RDONLY); })};
  if (!mem_fd) {
    return nullptr;
  }

  // Iterate over maps and look for the map containing the pc.  Then
  // look into the symbol tables inside.
  char buf[1024];  // Big enough for line of sane /proc/self/maps
  LineReader reader(maps_fd.get(), buf, sizeof(buf), 0);
  while (true) {
    const char* cursor;
    const char* eol;
    if (!reader.ReadLine(&cursor, &eol)) {  // EOF or malformed line.
      return nullptr;
    }

    // Start parsing line in /proc/self/maps.  Here is an example:
    //
    // 08048000-0804c000 r-xp 00000000 08:01 2142121    /bin/cat
    //
    // We want start address (08048000), end address (0804c000), flags
    // (r-xp) and file name (/bin/cat).

    // Read start address.
    cursor = GetHex(cursor, eol, &start_address);
    if (cursor == eol || *cursor != '-') {
      return nullptr;  // Malformed line.
    }
    ++cursor;  // Skip '-'.

    // Read end address.
    uint64_t end_address;
    cursor = GetHex(cursor, eol, &end_address);
    if (cursor == eol || *cursor != ' ') {
      return nullptr;  // Malformed line.
    }
    ++cursor;  // Skip ' '.

    // Read flags.  Skip flags until we encounter a space or eol.
    const char* const flags_start = cursor;
    while (cursor < eol && *cursor != ' ') {
      ++cursor;
    }
    // We expect at least four letters for flags (ex. "r-xp").
    if (cursor == eol || cursor < flags_start + 4) {
      return nullptr;  // Malformed line.
    }

    // Determine the base address by reading ELF headers in process memory.
    ElfW(Ehdr) ehdr;
    // Skip non-readable maps.
    if (flags_start[0] == 'r' &&
        ReadFromOffsetExact(mem_fd.get(), &ehdr, sizeof(ElfW(Ehdr)),
                            start_address) &&
        memcmp(ehdr.e_ident, ELFMAG, SELFMAG) == 0) {
      switch (ehdr.e_type) {
        case ET_EXEC:
          base_address = 0;
          break;
        case ET_DYN:
          // Find the segment containing file offset 0. This will correspond
          // to the ELF header that we just read. Normally this will have
          // virtual address 0, but this is not guaranteed. We must subtract
          // the virtual address from the address where the ELF header was
          // mapped to get the base address.
          //
          // If we fail to find a segment for file offset 0, use the address
          // of the ELF header as the base address.
          base_address = start_address;
          for (unsigned i = 0; i != ehdr.e_phnum; ++i) {
            ElfW(Phdr) phdr;
            if (ReadFromOffsetExact(
                    mem_fd.get(), &phdr, sizeof(phdr),
                    start_address + ehdr.e_phoff + i * sizeof(phdr)) &&
                phdr.p_type == PT_LOAD && phdr.p_offset == 0) {
              base_address = start_address - phdr.p_vaddr;
              break;
            }
          }
          break;
        default:
          // ET_REL or ET_CORE. These aren't directly executable, so they don't
          // affect the base address.
          break;
      }
    }

    // Check start and end addresses.
    if (start_address > pc || pc >= end_address) {
      continue;  // We skip this map.  PC isn't in this map.
    }

    // Check flags.  We are only interested in "r*x" maps.
    if (flags_start[0] != 'r' || flags_start[2] != 'x') {
      continue;  // We skip this map.
    }
    ++cursor;  // Skip ' '.

    // Read file offset.
    uint64_t file_offset;
    cursor = GetHex(cursor, eol, &file_offset);
    if (cursor == eol || *cursor != ' ') {
      return nullptr;  // Malformed line.
    }
    ++cursor;  // Skip ' '.

    // Skip to file name.  "cursor" now points to dev.  We need to
    // skip at least two spaces for dev and inode.
    int num_spaces = 0;
    while (cursor < eol) {
      if (*cursor == ' ') {
        ++num_spaces;
      } else if (num_spaces >= 2) {
        // The first non-space character after skipping two spaces
        // is the beginning of the file name.
        break;
      }
      ++cursor;
    }
    if (cursor == eol) {
      return nullptr;  // Malformed line.
    }

    // Finally, "cursor" now points to file name of our interest.
    FileDescriptor object_fd{
        FailureRetry([cursor] { return open(cursor, O_RDONLY); })};
    if (!object_fd) {
      // Failed to open object file.  Copy the object file name to
      // |out_file_name|.
      strncpy(out_file_name, cursor, out_file_name_size);
      // Making sure |out_file_name| is always null-terminated.
      out_file_name[out_file_name_size - 1] = '\0';
      return nullptr;
    }
    return object_fd;
  }
}